

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Validity * __thiscall
capnp::compiler::CompilerMain::verifyRequirements
          (Validity *__return_storage_ptr__,CompilerMain *this,Format format)

{
  StringPtr *in_RCX;
  bool local_79;
  ArrayPtr<const_char> local_50;
  String local_40;
  Schema local_28;
  Format local_1c;
  CompilerMain *pCStack_18;
  Format format_local;
  CompilerMain *this_local;
  
  local_1c = format;
  pCStack_18 = this;
  this_local = (CompilerMain *)__return_storage_ptr__;
  if ((format == TEXT) || (local_79 = false, format == JSON)) {
    StructSchema::StructSchema((StructSchema *)&local_28);
    local_79 = Schema::operator==(&(this->rootType).super_Schema,&local_28);
  }
  if (local_79 == false) {
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,true);
  }
  else {
    local_50 = (ArrayPtr<const_char>)toString(this,local_1c);
    kj::str<char_const(&)[25],kj::StringPtr>
              (&local_40,(kj *)"format requires schema: ",(char (*) [25])&local_50,in_RCX);
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,&local_40);
    kj::String::~String(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity verifyRequirements(Format format) {
    if ((format == Format::TEXT || format == Format::JSON) && rootType == StructSchema()) {
      return kj::str("format requires schema: ", toString(format));
    } else {
      return true;
    }
  }